

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t gt_virt_cnt_offset(CPUARMState_conflict *env)

{
  uint uVar1;
  uint64_t uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = (uint)env->features;
  if ((uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar1 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar1 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar1 = 2;
      }
      else {
        if ((env->features >> 0x21 & 1) != 0) {
          bVar4 = uVar3 == 0x16;
          if (!bVar4) {
            bVar4 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar1 >> 0x1c & 1) == 0) && (uVar1 = 3, bVar4)) goto LAB_006216bf;
        }
        uVar1 = 1;
      }
    }
    else {
      uVar1 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar1 = 1;
    if ((env->v7m).exception == 0) {
      uVar1 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_006216bf:
  if (uVar1 == 0) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    if ((~uVar2 & 0x408000000) == 0) {
      return 0;
    }
  }
  else if ((uVar1 == 2) && (uVar2 = arm_hcr_el2_eff_aarch64(env), (uVar2 & 0x400000000) != 0)) {
    return 0;
  }
  return (env->cp15).cntvoff_el2;
}

Assistant:

static uint64_t gt_virt_cnt_offset(CPUARMState *env)
{
    uint64_t hcr;

    switch (arm_current_el(env)) {
    case 2:
        hcr = arm_hcr_el2_eff(env);
        if (hcr & HCR_E2H) {
            return 0;
        }
        break;
    case 0:
        hcr = arm_hcr_el2_eff(env);
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            return 0;
        }
        break;
    }

    return env->cp15.cntvoff_el2;
}